

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O1

void __thiscall chrono::ChSystem::ChSystem(ChSystem *this,ChSystem *other)

{
  Type type;
  Type type_00;
  undefined1 auVar1 [32];
  ChAssembly local_180;
  
  (this->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable =
       (_func_int **)&PTR_GetNcoords_y_00b33ca8;
  ChAssembly::ChAssembly(&this->assembly);
  (this->G_acc).m_data[2] = 0.0;
  auVar1 = ZEXT1632(ZEXT816(0) << 0x40);
  this->contact_container = (shared_ptr<chrono::ChContactContainer>)auVar1._0_16_;
  (this->G_acc).m_data[0] = (double)auVar1._16_8_;
  (this->G_acc).m_data[1] = (double)auVar1._24_8_;
  this->descriptor = (shared_ptr<chrono::ChSystemDescriptor>)auVar1._0_16_;
  this->solver = (shared_ptr<chrono::ChSolver>)auVar1._16_16_;
  (this->output_dir)._M_dataplus._M_p = (pointer)&(this->output_dir).field_2;
  (this->output_dir)._M_string_length = 0;
  (this->output_dir).field_2._M_local_buf[0] = '\0';
  (this->timer_step).m_start.__d.__r = 0;
  (this->timer_step).m_end.__d.__r = 0;
  (this->timer_advance).m_start.__d.__r = 0;
  (this->timer_advance).m_end.__d.__r = 0;
  (this->timer_ls_solve).m_start.__d.__r = 0;
  (this->timer_ls_solve).m_end.__d.__r = 0;
  (this->timer_ls_setup).m_start.__d.__r = 0;
  (this->timer_ls_setup).m_end.__d.__r = 0;
  (this->timer_jacobian).m_start.__d.__r = 0;
  (this->timer_jacobian).m_end.__d.__r = 0;
  (this->timer_collision).m_start.__d.__r = 0;
  (this->timer_collision).m_end.__d.__r = 0;
  (this->timer_setup).m_start.__d.__r = 0;
  (this->timer_setup).m_end.__d.__r = 0;
  (this->timer_update).m_start.__d.__r = 0;
  (this->timer_update).m_end.__d.__r = 0;
  (this->timestepper).super___shared_ptr<chrono::ChTimestepper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->timestepper).super___shared_ptr<chrono::ChTimestepper,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->applied_forces).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->applied_forces).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  auVar1 = ZEXT1632(ZEXT816(0) << 0x40);
  this->collision_system = (shared_ptr<chrono::collision::ChCollisionSystem>)auVar1._0_16_;
  (this->collision_callbacks).
  super__Vector_base<std::shared_ptr<chrono::ChSystem::CustomCollisionCallback>,_std::allocator<std::shared_ptr<chrono::ChSystem::CustomCollisionCallback>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar1._16_8_;
  (this->collision_callbacks).
  super__Vector_base<std::shared_ptr<chrono::ChSystem::CustomCollisionCallback>,_std::allocator<std::shared_ptr<chrono::ChSystem::CustomCollisionCallback>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)auVar1._24_8_;
  this->collision_callbacks =
       (vector<std::shared_ptr<chrono::ChSystem::CustomCollisionCallback>,_std::allocator<std::shared_ptr<chrono::ChSystem::CustomCollisionCallback>_>_>
        )auVar1._0_24_;
  this->composition_strategy =
       (unique_ptr<chrono::ChMaterialCompositionStrategy,_std::default_delete<chrono::ChMaterialCompositionStrategy>_>
        )auVar1._24_8_;
  ChAssembly::ChAssembly(&local_180,&other->assembly);
  ChAssembly::operator=(&this->assembly,&local_180);
  ChAssembly::~ChAssembly(&local_180);
  (this->assembly).super_ChPhysicsItem.system = this;
  if (other != this) {
    (this->G_acc).m_data[0] = (other->G_acc).m_data[0];
    (this->G_acc).m_data[1] = (other->G_acc).m_data[1];
    (this->G_acc).m_data[2] = (other->G_acc).m_data[2];
  }
  this->ncoords = other->ncoords;
  this->ncoords_w = other->ncoords_w;
  this->ndoc = other->ndoc;
  this->ndoc_w = other->ndoc_w;
  this->ndoc_w_C = other->ndoc_w_C;
  this->ndoc_w_D = other->ndoc_w_D;
  this->ndof = other->ndof;
  this->nsysvars = other->nsysvars;
  this->nsysvars_w = other->nsysvars_w;
  this->ch_time = other->ch_time;
  this->step = other->step;
  this->step_min = other->step_min;
  this->step_max = other->step_max;
  this->stepcount = other->stepcount;
  this->solvecount = other->solvecount;
  this->setupcount = other->setupcount;
  this->write_matrix = other->write_matrix;
  std::__cxx11::string::_M_assign((string *)&this->output_dir);
  type = (*((other->timestepper).
            super___shared_ptr<chrono::ChTimestepper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           _vptr_ChTimestepper[2])();
  SetTimestepperType(this,type);
  this->tol_force = other->tol_force;
  this->nthreads_chrono = other->nthreads_chrono;
  this->nthreads_eigen = other->nthreads_eigen;
  this->nthreads_collision = other->nthreads_collision;
  this->is_initialized = false;
  this->is_updated = false;
  this->applied_forces_current = false;
  this->maxiter = other->maxiter;
  this->collision_system_type = other->collision_system_type;
  this->visual_system = (ChVisualSystem *)0x0;
  this->min_bounce_speed = other->min_bounce_speed;
  this->max_penetration_recovery_speed = other->max_penetration_recovery_speed;
  type_00 = (*((other->solver).super___shared_ptr<chrono::ChSolver,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_ChSolver[2])();
  SetSolverType(this,type_00);
  this->use_sleeping = other->use_sleeping;
  this->ncontacts = other->ncontacts;
  std::
  vector<std::shared_ptr<chrono::ChSystem::CustomCollisionCallback>,_std::allocator<std::shared_ptr<chrono::ChSystem::CustomCollisionCallback>_>_>
  ::operator=(&this->collision_callbacks,&other->collision_callbacks);
  this->last_err = other->last_err;
  return;
}

Assistant:

ChSystem::ChSystem(const ChSystem& other) {
    // Required by ChAssembly
    assembly = other.assembly;
    assembly.system = this;

    G_acc = other.G_acc;
    ncoords = other.ncoords;
    ncoords_w = other.ncoords_w;
    ndoc = other.ndoc;
    ndoc_w = other.ndoc_w;
    ndoc_w_C = other.ndoc_w_C;
    ndoc_w_D = other.ndoc_w_D;
    ndof = other.ndof;
    nsysvars = other.nsysvars;
    nsysvars_w = other.nsysvars_w;
    ch_time = other.ch_time;
    step = other.step;
    step_min = other.step_min;
    step_max = other.step_max;
    stepcount = other.stepcount;
    solvecount = other.solvecount;
    setupcount = other.setupcount;
    write_matrix = other.write_matrix;
    output_dir = other.output_dir;
    SetTimestepperType(other.GetTimestepperType());
    tol_force = other.tol_force;
    nthreads_chrono = other.nthreads_chrono;
    nthreads_eigen = other.nthreads_eigen;
    nthreads_collision = other.nthreads_collision;
    is_initialized = false;
    is_updated = false;
    applied_forces_current = false;
    maxiter = other.maxiter;

    collision_system_type = other.collision_system_type;

    visual_system = nullptr;

    min_bounce_speed = other.min_bounce_speed;
    max_penetration_recovery_speed = other.max_penetration_recovery_speed;
    SetSolverType(other.GetSolverType());
    use_sleeping = other.use_sleeping;

    ncontacts = other.ncontacts;

    collision_callbacks = other.collision_callbacks;

    last_err = other.last_err;
}